

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_place_num_procs(int place_num)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  int iVar6;
  ulong uVar7;
  long *plVar5;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar2 = 0;
  iVar6 = 0;
  if (((__kmp_affin_mask_size != 0) && (iVar6 = iVar2, -1 < place_num)) &&
     (place_num < (int)__kmp_affinity_num_masks)) {
    iVar2 = (*__kmp_affinity_dispatch->_vptr_KMPAffinity[8])
                      (__kmp_affinity_dispatch,__kmp_affinity_masks,place_num);
    plVar5 = (long *)CONCAT44(extraout_var,iVar2);
    uVar3 = (**(code **)(*plVar5 + 0x50))(plVar5);
    uVar4 = (**(code **)(*plVar5 + 0x58))(plVar5);
    if (uVar3 != uVar4) {
      iVar6 = 0;
      do {
        uVar7 = (ulong)uVar3;
        iVar2 = (*__kmp_affin_fullMask->_vptr_Mask[3])(__kmp_affin_fullMask,uVar7);
        if ((char)iVar2 != '\0') {
          bVar1 = (**(code **)(*plVar5 + 0x18))(plVar5,uVar7);
          iVar6 = iVar6 + (uint)bVar1;
        }
        uVar3 = (**(code **)(*plVar5 + 0x60))(plVar5,uVar7);
        uVar4 = (**(code **)(*plVar5 + 0x58))(plVar5);
      } while (uVar3 != uVar4);
    }
  }
  return iVar6;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PLACE_NUM_PROCS)(int place_num) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int i;
  int retval = 0;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  if (place_num < 0 || place_num >= (int)__kmp_affinity_num_masks)
    return 0;
  kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
  KMP_CPU_SET_ITERATE(i, mask) {
    if ((!KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
        (!KMP_CPU_ISSET(i, mask))) {
      continue;
    }
    ++retval;
  }
  return retval;
#endif
}